

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_opt_gen.cpp
# Opt level: O0

void get_msurf_descriptor_haar_unroll_4_3_True(integral_image *iimage,interest_point *ipoint)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int row;
  int row_00;
  int row_01;
  int row_02;
  int iVar16;
  int iVar17;
  int col;
  int col_00;
  int col_01;
  float *in_RSI;
  integral_image *in_RDI;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  integral_image *iimage_00;
  float *haarX;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [64];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  int i_1;
  float norm_factor;
  float d4;
  float d3;
  float d2;
  float d1;
  float gauss_s2;
  float rry;
  float rrx;
  float ry;
  float rx;
  float gauss_s1;
  float gauss_s1_x;
  int k_2;
  int gauss_index_k;
  float gauss_s1_y;
  int l_2;
  int gauss_index_l_inc;
  int gauss_index_l;
  float mdy;
  float mdx;
  float dy;
  float dx;
  float *j_arr;
  int j;
  int gauss_index_k_inc;
  int gauss_index_k_start;
  float *i_arr;
  int i;
  float e_c1_p4;
  float e_c1_p3;
  float e_c1_p2;
  float e_c1_p1;
  float e_c1_m1;
  float e_c1_m2;
  float e_c1_m3;
  float e_c1_m4;
  float e_c0_p4;
  float e_c0_p3;
  float e_c0_p2;
  float e_c0_p1;
  float e_c0_m1;
  float e_c0_m2;
  float e_c0_m3;
  float e_c0_m4;
  float s11;
  float s10;
  float s9;
  float s8;
  float s7;
  float s6;
  float s5;
  float s4;
  float s3;
  float s2;
  float s1;
  float s0;
  int sample_x_sub_int_scale2_1;
  int sample_x_sub_int_scale1_1;
  int sample_x_sub_int_scale0_1;
  int k_count2_1;
  int k_count1_1;
  int k_count0_1;
  int k2_1;
  int k1_1;
  int k0_1;
  int k_count_1;
  int k_1;
  int sample_y_sub_int_scale3_1;
  int sample_y_sub_int_scale2_1;
  int sample_y_sub_int_scale1_1;
  int sample_y_sub_int_scale0_1;
  int l_count3_1;
  int l_count2_1;
  int l_count1_1;
  int l_count0_1;
  int l3_1;
  int l2_1;
  int l1_1;
  int l0_1;
  int l_count_1;
  int l_1;
  int sample_x_sub_int_scale2;
  int sample_x_sub_int_scale1;
  int sample_x_sub_int_scale0;
  float ipoint_x_sub_int_scale_add_k2_mul_scale;
  float ipoint_x_sub_int_scale_add_k1_mul_scale;
  float ipoint_x_sub_int_scale_add_k0_mul_scale;
  int k_count2;
  int k_count1;
  int k_count0;
  int k2;
  int k1;
  int k0;
  int k_count;
  int k;
  int sample_y_sub_int_scale3;
  int sample_y_sub_int_scale2;
  int sample_y_sub_int_scale1;
  int sample_y_sub_int_scale0;
  float ipoint_y_sub_int_scale_add_l3_mul_scale;
  float ipoint_y_sub_int_scale_add_l2_mul_scale;
  float ipoint_y_sub_int_scale_add_l1_mul_scale;
  float ipoint_y_sub_int_scale_add_l0_mul_scale;
  int l_count3;
  int l_count2;
  int l_count1;
  int l_count0;
  int l3;
  int l2;
  int l1;
  int l0;
  int l_count;
  int l;
  int gauss_s2_index;
  float sum_of_squares;
  int desc_idx;
  float *descriptor;
  int height;
  int width;
  float ipoint_y_sub_int_scale_add_05;
  float ipoint_x_sub_int_scale_add_05;
  float ipoint_y_sub_int_scale;
  float ipoint_x_sub_int_scale;
  float ipoint_y;
  float ipoint_x;
  float g1_factor;
  float scale_squared;
  int int_scale;
  float scale;
  double local_2c8;
  float *haarY;
  undefined8 uVar95;
  undefined8 uVar96;
  int local_22c;
  int local_1f8;
  int local_1f4;
  int local_1ec;
  int local_1e4;
  float local_1e0;
  float local_1dc;
  float local_1d8;
  float local_1d4;
  float *local_1d0;
  int local_1c4;
  float *local_1b8;
  int local_1ac;
  int local_114;
  int local_110;
  int local_dc;
  int local_d8;
  int local_a0;
  int local_58;
  int local_54;
  float local_50;
  int local_4c;
  
  fVar33 = in_RSI[2];
  auVar26._8_4_ = 0x80000000;
  auVar26._0_8_ = 0x8000000080000000;
  auVar26._12_4_ = 0x80000000;
  auVar20._8_4_ = 0x3effffff;
  auVar20._0_8_ = 0x3effffff3effffff;
  auVar20._12_4_ = 0x3effffff;
  auVar18 = vpternlogd_avx512vl(auVar20,ZEXT416((uint)fVar33),auVar26,0xf8);
  auVar18 = vroundss_avx(ZEXT416((uint)fVar33),ZEXT416((uint)(fVar33 + auVar18._0_4_)),0xb);
  iVar12 = (int)auVar18._0_4_;
  fVar28 = -0.08 / (fVar33 * fVar33);
  fVar1 = *in_RSI;
  auVar27._8_4_ = 0x80000000;
  auVar27._0_8_ = 0x8000000080000000;
  auVar27._12_4_ = 0x80000000;
  auVar21._8_4_ = 0x3effffff;
  auVar21._0_8_ = 0x3effffff3effffff;
  auVar21._12_4_ = 0x3effffff;
  auVar18 = vpternlogd_avx512vl(auVar21,ZEXT416((uint)fVar1),auVar27,0xf8);
  auVar18 = vroundss_avx(ZEXT416((uint)fVar1),ZEXT416((uint)(fVar1 + auVar18._0_4_)),0xb);
  auVar24._0_8_ = (double)auVar18._0_4_;
  auVar24._8_8_ = 0;
  auVar18._0_8_ = (double)fVar33;
  auVar18._8_8_ = 0;
  auVar18 = vfmadd213sd_fma(ZEXT816(0x3fe0000000000000),auVar18,auVar24);
  fVar29 = (float)auVar18._0_8_;
  fVar1 = in_RSI[1];
  auVar78._8_4_ = 0x80000000;
  auVar78._0_8_ = 0x8000000080000000;
  auVar78._12_4_ = 0x80000000;
  auVar22._8_4_ = 0x3effffff;
  auVar22._0_8_ = 0x3effffff3effffff;
  auVar22._12_4_ = 0x3effffff;
  auVar18 = vpternlogd_avx512vl(auVar22,ZEXT416((uint)fVar1),auVar78,0xf8);
  auVar18 = vroundss_avx(ZEXT416((uint)fVar1),ZEXT416((uint)(fVar1 + auVar18._0_4_)),0xb);
  auVar25._0_8_ = (double)auVar18._0_4_;
  auVar25._8_8_ = 0;
  auVar19._0_8_ = (double)fVar33;
  auVar19._8_8_ = 0;
  auVar18 = vfmadd213sd_fma(ZEXT816(0x3fe0000000000000),auVar19,auVar25);
  fVar30 = (float)auVar18._0_8_;
  fVar1 = fVar29 - (float)iVar12;
  fVar2 = fVar30 - (float)iVar12;
  fVar3 = (fVar29 - (float)iVar12) + 0.5;
  fVar4 = (fVar30 - (float)iVar12) + 0.5;
  local_4c = 0;
  local_50 = 0.0;
  local_54 = 0;
  auVar18 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1400000),0),ZEXT416((uint)fVar33),
                            ZEXT416((uint)fVar29));
  auVar79._8_4_ = 0x80000000;
  auVar79._0_8_ = 0x8000000080000000;
  auVar79._12_4_ = 0x80000000;
  auVar23._8_4_ = 0x3effffff;
  auVar23._0_8_ = 0x3effffff3effffff;
  auVar23._12_4_ = 0x3effffff;
  auVar19 = vpternlogd_avx512vl(auVar23,auVar18,auVar79,0xf8);
  auVar18 = vroundss_avx(auVar18,ZEXT416((uint)(auVar18._0_4_ + auVar19._0_4_)),0xb);
  auVar46 = ZEXT1664(auVar18);
  if (0 < (int)auVar18._0_4_ - iVar12) {
    auVar18 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1400000),0),ZEXT416((uint)fVar33),
                              ZEXT416((uint)fVar30));
    auVar80._8_4_ = 0x80000000;
    auVar80._0_8_ = 0x8000000080000000;
    auVar80._12_4_ = 0x80000000;
    auVar47._8_4_ = 0x3effffff;
    auVar47._0_8_ = 0x3effffff3effffff;
    auVar47._12_4_ = 0x3effffff;
    auVar19 = vpternlogd_avx512vl(auVar47,auVar18,auVar80,0xf8);
    auVar18 = vroundss_avx(auVar18,ZEXT416((uint)(auVar18._0_4_ + auVar19._0_4_)),0xb);
    auVar46 = ZEXT1664(auVar18);
    if (0 < (int)auVar18._0_4_ - iVar12) {
      auVar18 = vfmadd213ss_fma(SUB6416(ZEXT464(0x41300000),0),ZEXT416((uint)fVar33),
                                ZEXT416((uint)fVar29));
      auVar81._8_4_ = 0x80000000;
      auVar81._0_8_ = 0x8000000080000000;
      auVar81._12_4_ = 0x80000000;
      auVar48._8_4_ = 0x3effffff;
      auVar48._0_8_ = 0x3effffff3effffff;
      auVar48._12_4_ = 0x3effffff;
      auVar19 = vpternlogd_avx512vl(auVar48,auVar18,auVar81,0xf8);
      auVar18 = vroundss_avx(auVar18,ZEXT416((uint)(auVar18._0_4_ + auVar19._0_4_)),0xb);
      auVar46 = ZEXT1664(auVar18);
      if ((int)auVar18._0_4_ + iVar12 <= in_RDI->width) {
        auVar18 = vfmadd213ss_fma(SUB6416(ZEXT464(0x41300000),0),ZEXT416((uint)fVar33),
                                  ZEXT416((uint)fVar30));
        auVar82._8_4_ = 0x80000000;
        auVar82._0_8_ = 0x8000000080000000;
        auVar82._12_4_ = 0x80000000;
        auVar49._8_4_ = 0x3effffff;
        auVar49._0_8_ = 0x3effffff3effffff;
        auVar49._12_4_ = 0x3effffff;
        auVar19 = vpternlogd_avx512vl(auVar49,auVar18,auVar82,0xf8);
        auVar18 = vroundss_avx(auVar18,ZEXT416((uint)(auVar18._0_4_ + auVar19._0_4_)),0xb);
        auVar46 = ZEXT1664(auVar18);
        if ((int)auVar18._0_4_ + iVar12 <= in_RDI->height) {
          local_dc = 0;
          for (local_d8 = -0xc; local_d8 < 0xc; local_d8 = local_d8 + 4) {
            iVar13 = local_dc + 1;
            iVar14 = local_dc + 2;
            iVar15 = local_dc + 3;
            auVar57._0_4_ = (float)local_d8;
            auVar57._4_12_ = auVar46._4_12_;
            auVar18 = vfmadd213ss_fma(ZEXT416((uint)fVar33),auVar57,ZEXT416((uint)fVar4));
            row = (int)auVar18._0_4_;
            auVar58._0_4_ = (float)(local_d8 + 1);
            auVar58._4_12_ = auVar18._4_12_;
            auVar18 = vfmadd213ss_fma(ZEXT416((uint)fVar33),auVar58,ZEXT416((uint)fVar4));
            row_00 = (int)auVar18._0_4_;
            auVar59._0_4_ = (float)(local_d8 + 2);
            auVar59._4_12_ = auVar18._4_12_;
            auVar18 = vfmadd213ss_fma(ZEXT416((uint)fVar33),auVar59,ZEXT416((uint)fVar4));
            row_01 = (int)auVar18._0_4_;
            auVar60._0_4_ = (float)(local_d8 + 3);
            auVar60._4_12_ = auVar18._4_12_;
            auVar18 = vfmadd213ss_fma(ZEXT416((uint)fVar33),auVar60,ZEXT416((uint)fVar4));
            auVar46 = ZEXT1664(auVar18);
            row_02 = (int)auVar18._0_4_;
            local_114 = 0;
            for (local_110 = -0xc; local_110 < 0xc; local_110 = local_110 + 3) {
              iVar16 = local_114 + 1;
              iVar17 = local_114 + 2;
              auVar61._0_4_ = (float)local_110;
              auVar61._4_12_ = auVar46._4_12_;
              auVar18 = vfmadd213ss_fma(ZEXT416((uint)fVar33),auVar61,ZEXT416((uint)fVar3));
              col = (int)auVar18._0_4_;
              auVar62._0_4_ = (float)(local_110 + 1);
              auVar62._4_12_ = auVar18._4_12_;
              auVar18 = vfmadd213ss_fma(ZEXT416((uint)fVar33),auVar62,ZEXT416((uint)fVar3));
              col_00 = (int)auVar18._0_4_;
              auVar63._0_4_ = (float)(local_110 + 2);
              auVar63._4_12_ = auVar18._4_12_;
              auVar18 = vfmadd213ss_fma(ZEXT416((uint)fVar33),auVar63,ZEXT416((uint)fVar3));
              auVar46 = ZEXT1664(auVar18);
              col_01 = (int)auVar18._0_4_;
              haarXY_unconditional
                        (in_RDI,row,col,iVar12,haarResponseX + (local_dc * 0x18 + local_114),
                         haarResponseY + (local_dc * 0x18 + local_114));
              haarXY_unconditional
                        (in_RDI,row_00,col,iVar12,haarResponseX + (iVar13 * 0x18 + local_114),
                         haarResponseY + (iVar13 * 0x18 + local_114));
              haarXY_unconditional
                        (in_RDI,row_01,col,iVar12,haarResponseX + (iVar14 * 0x18 + local_114),
                         haarResponseY + (iVar14 * 0x18 + local_114));
              haarXY_unconditional
                        (in_RDI,row_02,col,iVar12,haarResponseX + (iVar15 * 0x18 + local_114),
                         haarResponseY + (iVar15 * 0x18 + local_114));
              haarXY_unconditional
                        (in_RDI,row,col_00,iVar12,haarResponseX + (local_dc * 0x18 + iVar16),
                         haarResponseY + (local_dc * 0x18 + iVar16));
              haarXY_unconditional
                        (in_RDI,row_00,col_00,iVar12,haarResponseX + (iVar13 * 0x18 + iVar16),
                         haarResponseY + (iVar13 * 0x18 + iVar16));
              haarXY_unconditional
                        (in_RDI,row_01,col_00,iVar12,haarResponseX + (iVar14 * 0x18 + iVar16),
                         haarResponseY + (iVar14 * 0x18 + iVar16));
              haarXY_unconditional
                        (in_RDI,row_02,col_00,iVar12,haarResponseX + (iVar15 * 0x18 + iVar16),
                         haarResponseY + (iVar15 * 0x18 + iVar16));
              haarXY_unconditional
                        (in_RDI,row,col_01,iVar12,haarResponseX + (local_dc * 0x18 + iVar17),
                         haarResponseY + (local_dc * 0x18 + iVar17));
              haarXY_unconditional
                        (in_RDI,row_00,col_01,iVar12,haarResponseX + (iVar13 * 0x18 + iVar17),
                         haarResponseY + (iVar13 * 0x18 + iVar17));
              haarXY_unconditional
                        (in_RDI,row_01,col_01,iVar12,haarResponseX + (iVar14 * 0x18 + iVar17),
                         haarResponseY + (iVar14 * 0x18 + iVar17));
              haarXY_unconditional
                        (in_RDI,row_02,col_01,iVar12,haarResponseX + (iVar15 * 0x18 + iVar17),
                         haarResponseY + (iVar15 * 0x18 + iVar17));
              local_114 = local_114 + 3;
            }
            local_dc = local_dc + 4;
          }
          goto LAB_00227564;
        }
      }
    }
  }
  for (local_58 = -0xc; local_58 < 0xc; local_58 = local_58 + 4) {
    auVar50._0_4_ = (float)local_58;
    auVar50._4_12_ = auVar46._4_12_;
    auVar18 = vfmadd213ss_fma(ZEXT416((uint)fVar33),auVar50,ZEXT416((uint)fVar2));
    auVar51._0_4_ = (float)(local_58 + 1);
    auVar51._4_12_ = auVar18._4_12_;
    auVar18 = vfmadd213ss_fma(ZEXT416((uint)fVar33),auVar51,ZEXT416((uint)fVar2));
    auVar52._0_4_ = (float)(local_58 + 2);
    auVar52._4_12_ = auVar18._4_12_;
    auVar19 = vfmadd213ss_fma(ZEXT416((uint)fVar33),auVar52,ZEXT416((uint)fVar2));
    auVar53._0_4_ = (float)(local_58 + 3);
    auVar53._4_12_ = auVar19._4_12_;
    auVar20 = vfmadd213ss_fma(ZEXT416((uint)fVar33),auVar53,ZEXT416((uint)fVar2));
    iimage_00 = (integral_image *)(double)auVar18._0_4_;
    haarX = (float *)(double)auVar19._0_4_;
    uVar95 = 0xbfe0000000000000;
    uVar96 = 0x3fe0000000000000;
    if (auVar19._0_4_ < 0.0) {
      uVar96 = 0xbfe0000000000000;
    }
    haarY = (float *)0x3fe0000000000000;
    if (auVar20._0_4_ < 0.0) {
      haarY = (float *)0xbfe0000000000000;
    }
    auVar46 = ZEXT864((ulong)((double)auVar20._0_4_ + (double)haarY));
    for (local_a0 = -0xc; local_a0 < 0xc; local_a0 = local_a0 + 3) {
      auVar54._0_4_ = (float)local_a0;
      auVar54._4_12_ = auVar46._4_12_;
      auVar18 = vfmadd213ss_fma(ZEXT416((uint)fVar33),auVar54,ZEXT416((uint)fVar1));
      auVar55._0_4_ = (float)(local_a0 + 1);
      auVar55._4_12_ = auVar18._4_12_;
      auVar18 = vfmadd213ss_fma(ZEXT416((uint)fVar33),auVar55,ZEXT416((uint)fVar1));
      auVar56._0_4_ = (float)(local_a0 + 2);
      auVar56._4_12_ = auVar18._4_12_;
      auVar18 = vfmadd213ss_fma(ZEXT416((uint)fVar33),auVar56,ZEXT416((uint)fVar1));
      local_2c8 = 0.5;
      if (auVar18._0_4_ < 0.0) {
        local_2c8 = -0.5;
      }
      auVar46 = ZEXT864((ulong)((double)auVar18._0_4_ + local_2c8));
      haarXY_precheck_boundaries
                (iimage_00,(int)((ulong)uVar96 >> 0x20),(int)uVar96,(int)((ulong)uVar95 >> 0x20),
                 haarX,haarY);
      haarXY_precheck_boundaries
                (iimage_00,(int)((ulong)uVar96 >> 0x20),(int)uVar96,(int)((ulong)uVar95 >> 0x20),
                 haarX,haarY);
      haarXY_precheck_boundaries
                (iimage_00,(int)((ulong)uVar96 >> 0x20),(int)uVar96,(int)((ulong)uVar95 >> 0x20),
                 haarX,haarY);
      haarXY_precheck_boundaries
                (iimage_00,(int)((ulong)uVar96 >> 0x20),(int)uVar96,(int)((ulong)uVar95 >> 0x20),
                 haarX,haarY);
      haarXY_precheck_boundaries
                (iimage_00,(int)((ulong)uVar96 >> 0x20),(int)uVar96,(int)((ulong)uVar95 >> 0x20),
                 haarX,haarY);
      haarXY_precheck_boundaries
                (iimage_00,(int)((ulong)uVar96 >> 0x20),(int)uVar96,(int)((ulong)uVar95 >> 0x20),
                 haarX,haarY);
      haarXY_precheck_boundaries
                (iimage_00,(int)((ulong)uVar96 >> 0x20),(int)uVar96,(int)((ulong)uVar95 >> 0x20),
                 haarX,haarY);
      haarXY_precheck_boundaries
                (iimage_00,(int)((ulong)uVar96 >> 0x20),(int)uVar96,(int)((ulong)uVar95 >> 0x20),
                 haarX,haarY);
      haarXY_precheck_boundaries
                (iimage_00,(int)((ulong)uVar96 >> 0x20),(int)uVar96,(int)((ulong)uVar95 >> 0x20),
                 haarX,haarY);
      haarXY_precheck_boundaries
                (iimage_00,(int)((ulong)uVar96 >> 0x20),(int)uVar96,(int)((ulong)uVar95 >> 0x20),
                 haarX,haarY);
      haarXY_precheck_boundaries
                (iimage_00,(int)((ulong)uVar96 >> 0x20),(int)uVar96,(int)((ulong)uVar95 >> 0x20),
                 haarX,haarY);
      haarXY_precheck_boundaries
                (iimage_00,(int)((ulong)uVar96 >> 0x20),(int)uVar96,(int)((ulong)uVar95 >> 0x20),
                 haarX,haarY);
    }
  }
LAB_00227564:
  auVar34._4_12_ = SUB1612(ZEXT816(0x3fe0000000000000),4);
  auVar34._0_4_ = fVar33 * 0.5;
  auVar83._8_4_ = 0x80000000;
  auVar83._0_8_ = 0x8000000080000000;
  auVar83._12_4_ = 0x80000000;
  auVar64._8_4_ = 0x3effffff;
  auVar64._0_8_ = 0x3effffff3effffff;
  auVar64._12_4_ = 0x3effffff;
  auVar18 = vpternlogd_avx512vl(auVar64,auVar34,auVar83,0xf8);
  auVar18 = vroundss_avx(auVar34,ZEXT416((uint)(fVar33 * 0.5 + auVar18._0_4_)),0xb);
  auVar35._4_12_ = SUB1612(ZEXT816(0x3ff8000000000000),4);
  auVar35._0_4_ = fVar33 * 1.5;
  auVar84._8_4_ = 0x80000000;
  auVar84._0_8_ = 0x8000000080000000;
  auVar84._12_4_ = 0x80000000;
  auVar65._8_4_ = 0x3effffff;
  auVar65._0_8_ = 0x3effffff3effffff;
  auVar65._12_4_ = 0x3effffff;
  auVar19 = vpternlogd_avx512vl(auVar65,auVar35,auVar84,0xf8);
  auVar19 = vroundss_avx(auVar35,ZEXT416((uint)(fVar33 * 1.5 + auVar19._0_4_)),0xb);
  auVar36._4_12_ = SUB1612(ZEXT816(0x4004000000000000),4);
  auVar36._0_4_ = fVar33 * 2.5;
  auVar85._8_4_ = 0x80000000;
  auVar85._0_8_ = 0x8000000080000000;
  auVar85._12_4_ = 0x80000000;
  auVar66._8_4_ = 0x3effffff;
  auVar66._0_8_ = 0x3effffff3effffff;
  auVar66._12_4_ = 0x3effffff;
  auVar20 = vpternlogd_avx512vl(auVar66,auVar36,auVar85,0xf8);
  auVar20 = vroundss_avx(auVar36,ZEXT416((uint)(fVar33 * 2.5 + auVar20._0_4_)),0xb);
  fVar31 = auVar20._0_4_;
  auVar37._4_12_ = SUB1612(ZEXT816(0x400c000000000000),4);
  auVar37._0_4_ = fVar33 * 3.5;
  auVar86._8_4_ = 0x80000000;
  auVar86._0_8_ = 0x8000000080000000;
  auVar86._12_4_ = 0x80000000;
  auVar67._8_4_ = 0x3effffff;
  auVar67._0_8_ = 0x3effffff3effffff;
  auVar67._12_4_ = 0x3effffff;
  auVar20 = vpternlogd_avx512vl(auVar67,auVar37,auVar86,0xf8);
  auVar20 = vroundss_avx(auVar37,ZEXT416((uint)(fVar33 * 3.5 + auVar20._0_4_)),0xb);
  auVar38._4_12_ = SUB1612(ZEXT816(0x4012000000000000),4);
  auVar38._0_4_ = fVar33 * 4.5;
  auVar87._8_4_ = 0x80000000;
  auVar87._0_8_ = 0x8000000080000000;
  auVar87._12_4_ = 0x80000000;
  auVar68._8_4_ = 0x3effffff;
  auVar68._0_8_ = 0x3effffff3effffff;
  auVar68._12_4_ = 0x3effffff;
  auVar21 = vpternlogd_avx512vl(auVar68,auVar38,auVar87,0xf8);
  auVar21 = vroundss_avx(auVar38,ZEXT416((uint)(fVar33 * 4.5 + auVar21._0_4_)),0xb);
  auVar39._4_12_ = SUB1612(ZEXT816(0x4016000000000000),4);
  auVar39._0_4_ = fVar33 * 5.5;
  auVar88._8_4_ = 0x80000000;
  auVar88._0_8_ = 0x8000000080000000;
  auVar88._12_4_ = 0x80000000;
  auVar69._8_4_ = 0x3effffff;
  auVar69._0_8_ = 0x3effffff3effffff;
  auVar69._12_4_ = 0x3effffff;
  auVar22 = vpternlogd_avx512vl(auVar69,auVar39,auVar88,0xf8);
  auVar22 = vroundss_avx(auVar39,ZEXT416((uint)(fVar33 * 5.5 + auVar22._0_4_)),0xb);
  auVar40._4_12_ = SUB1612(ZEXT816(0x401a000000000000),4);
  auVar40._0_4_ = fVar33 * 6.5;
  auVar89._8_4_ = 0x80000000;
  auVar89._0_8_ = 0x8000000080000000;
  auVar89._12_4_ = 0x80000000;
  auVar70._8_4_ = 0x3effffff;
  auVar70._0_8_ = 0x3effffff3effffff;
  auVar70._12_4_ = 0x3effffff;
  auVar23 = vpternlogd_avx512vl(auVar70,auVar40,auVar89,0xf8);
  auVar23 = vroundss_avx(auVar40,ZEXT416((uint)(fVar33 * 6.5 + auVar23._0_4_)),0xb);
  auVar41._4_12_ = SUB1612(ZEXT816(0x401e000000000000),4);
  auVar41._0_4_ = fVar33 * 7.5;
  auVar90._8_4_ = 0x80000000;
  auVar90._0_8_ = 0x8000000080000000;
  auVar90._12_4_ = 0x80000000;
  auVar71._8_4_ = 0x3effffff;
  auVar71._0_8_ = 0x3effffff3effffff;
  auVar71._12_4_ = 0x3effffff;
  auVar24 = vpternlogd_avx512vl(auVar71,auVar41,auVar90,0xf8);
  auVar24 = vroundss_avx(auVar41,ZEXT416((uint)(fVar33 * 7.5 + auVar24._0_4_)),0xb);
  fVar32 = auVar24._0_4_;
  auVar42._4_12_ = SUB1612(ZEXT816(0x4021000000000000),4);
  auVar42._0_4_ = fVar33 * 8.5;
  auVar91._8_4_ = 0x80000000;
  auVar91._0_8_ = 0x8000000080000000;
  auVar91._12_4_ = 0x80000000;
  auVar72._8_4_ = 0x3effffff;
  auVar72._0_8_ = 0x3effffff3effffff;
  auVar72._12_4_ = 0x3effffff;
  auVar24 = vpternlogd_avx512vl(auVar72,auVar42,auVar91,0xf8);
  auVar24 = vroundss_avx(auVar42,ZEXT416((uint)(fVar33 * 8.5 + auVar24._0_4_)),0xb);
  auVar43._4_12_ = SUB1612(ZEXT816(0x4023000000000000),4);
  auVar43._0_4_ = fVar33 * 9.5;
  auVar92._8_4_ = 0x80000000;
  auVar92._0_8_ = 0x8000000080000000;
  auVar92._12_4_ = 0x80000000;
  auVar73._8_4_ = 0x3effffff;
  auVar73._0_8_ = 0x3effffff3effffff;
  auVar73._12_4_ = 0x3effffff;
  auVar25 = vpternlogd_avx512vl(auVar73,auVar43,auVar92,0xf8);
  auVar25 = vroundss_avx(auVar43,ZEXT416((uint)(fVar33 * 9.5 + auVar25._0_4_)),0xb);
  auVar44._4_12_ = SUB1612(ZEXT816(0x4025000000000000),4);
  auVar44._0_4_ = fVar33 * 10.5;
  auVar93._8_4_ = 0x80000000;
  auVar93._0_8_ = 0x8000000080000000;
  auVar93._12_4_ = 0x80000000;
  auVar74._8_4_ = 0x3effffff;
  auVar74._0_8_ = 0x3effffff3effffff;
  auVar74._12_4_ = 0x3effffff;
  auVar26 = vpternlogd_avx512vl(auVar74,auVar44,auVar93,0xf8);
  auVar26 = vroundss_avx(auVar44,ZEXT416((uint)(fVar33 * 10.5 + auVar26._0_4_)),0xb);
  auVar45._4_12_ = SUB1612(ZEXT816(0x4027000000000000),4);
  auVar45._0_4_ = fVar33 * 11.5;
  auVar94._8_4_ = 0x80000000;
  auVar94._0_8_ = 0x8000000080000000;
  auVar94._12_4_ = 0x80000000;
  auVar75._8_4_ = 0x3effffff;
  auVar75._0_8_ = 0x3effffff3effffff;
  auVar75._12_4_ = 0x3effffff;
  auVar27 = vpternlogd_avx512vl(auVar75,auVar45,auVar94,0xf8);
  auVar27 = vroundss_avx(auVar45,ZEXT416((uint)(fVar33 * 11.5 + auVar27._0_4_)),0xb);
  fVar33 = fVar31 + auVar19._0_4_;
  fVar1 = fVar31 + auVar18._0_4_;
  fVar2 = fVar31 - auVar18._0_4_;
  fVar3 = fVar31 - auVar19._0_4_;
  fVar4 = fVar31 - auVar20._0_4_;
  fVar29 = fVar31 - auVar21._0_4_;
  fVar30 = fVar31 - auVar22._0_4_;
  fVar31 = fVar31 - auVar23._0_4_;
  fVar5 = fVar32 - auVar20._0_4_;
  fVar6 = fVar32 - auVar21._0_4_;
  fVar7 = fVar32 - auVar22._0_4_;
  fVar8 = fVar32 - auVar23._0_4_;
  fVar9 = fVar32 - auVar24._0_4_;
  fVar10 = fVar32 - auVar25._0_4_;
  fVar11 = fVar32 - auVar26._0_4_;
  fVar32 = fVar32 - auVar27._0_4_;
  gauss_s1_c0[0] = expf(fVar28 * fVar33 * fVar33);
  gauss_s1_c0[1] = expf(fVar28 * fVar1 * fVar1);
  gauss_s1_c0[2] = expf(fVar28 * fVar2 * fVar2);
  gauss_s1_c0[3] = expf(fVar28 * fVar3 * fVar3);
  gauss_s1_c0[4] = 1.0;
  gauss_s1_c0[5] = expf(fVar28 * fVar4 * fVar4);
  gauss_s1_c0[6] = expf(fVar28 * fVar29 * fVar29);
  gauss_s1_c0[7] = expf(fVar28 * fVar30 * fVar30);
  gauss_s1_c0[8] = expf(fVar28 * fVar31 * fVar31);
  gauss_s1_c1[0] = expf(fVar28 * fVar5 * fVar5);
  gauss_s1_c1[1] = expf(fVar28 * fVar6 * fVar6);
  gauss_s1_c1[2] = expf(fVar28 * fVar7 * fVar7);
  gauss_s1_c1[3] = expf(fVar28 * fVar8 * fVar8);
  gauss_s1_c1[4] = 1.0;
  gauss_s1_c1[5] = expf(fVar28 * fVar9 * fVar9);
  gauss_s1_c1[6] = expf(fVar28 * fVar10 * fVar10);
  gauss_s1_c1[7] = expf(fVar28 * fVar11 * fVar11);
  gauss_s1_c1[8] = expf(fVar28 * fVar32 * fVar32);
  for (local_1ac = -8; local_1ac < 8; local_1ac = local_1ac + 5) {
    if ((local_1ac == -8) || (local_1ac == 7)) {
      local_1b8 = gauss_s1_c1;
    }
    else {
      local_1b8 = gauss_s1_c0;
    }
    iVar12 = 0;
    if (local_1ac < 0) {
      iVar12 = 8;
    }
    iVar13 = 1;
    if (local_1ac < 0) {
      iVar13 = -1;
    }
    for (local_1c4 = -8; local_1c4 < 8; local_1c4 = local_1c4 + 5) {
      if ((local_1c4 == -8) || (local_1c4 == 7)) {
        local_1d0 = gauss_s1_c1;
      }
      else {
        local_1d0 = gauss_s1_c0;
      }
      local_1d4 = 0.0;
      local_1d8 = 0.0;
      local_1dc = 0.0;
      local_1e0 = 0.0;
      local_1e4 = 0;
      if (local_1c4 < 0) {
        local_1e4 = 8;
      }
      iVar14 = 1;
      if (local_1c4 < 0) {
        iVar14 = -1;
      }
      for (local_1ec = (local_1c4 + 8) * 0x18;
          SBORROW4(local_1ec,(local_1c4 + 0x11) * 0x18) !=
          local_1ec + (local_1c4 + 0x11) * -0x18 < 0; local_1ec = local_1ec + 0x18) {
        local_1f4 = iVar12;
        for (local_1f8 = local_1ac + 8; local_1f8 < local_1ac + 0x11; local_1f8 = local_1f8 + 1) {
          fVar33 = local_1b8[local_1f4] * local_1d0[local_1e4] *
                   haarResponseY[local_1ec + local_1f8];
          fVar1 = local_1b8[local_1f4] * local_1d0[local_1e4] * haarResponseX[local_1ec + local_1f8]
          ;
          local_1d4 = fVar33 + local_1d4;
          local_1d8 = fVar1 + local_1d8;
          auVar76._8_4_ = 0x7fffffff;
          auVar76._0_8_ = 0x7fffffff7fffffff;
          auVar76._12_4_ = 0x7fffffff;
          auVar18 = vpand_avx(ZEXT416((uint)fVar33),auVar76);
          local_1dc = auVar18._0_4_ + local_1dc;
          auVar77._8_4_ = 0x7fffffff;
          auVar77._0_8_ = 0x7fffffff7fffffff;
          auVar77._12_4_ = 0x7fffffff;
          auVar18 = vpand_avx(ZEXT416((uint)fVar1),auVar77);
          local_1e0 = auVar18._0_4_ + local_1e0;
          local_1f4 = iVar13 + local_1f4;
        }
        local_1e4 = iVar14 + local_1e4;
      }
      fVar33 = gauss_s2_arr[local_54];
      local_54 = local_54 + 1;
      local_1d4 = local_1d4 * fVar33;
      local_1d8 = local_1d8 * fVar33;
      local_1dc = local_1dc * fVar33;
      local_1e0 = local_1e0 * fVar33;
      in_RSI[(long)local_4c + 5] = local_1d4;
      in_RSI[(long)(local_4c + 1) + 5] = local_1d8;
      in_RSI[(long)(local_4c + 2) + 5] = local_1dc;
      in_RSI[(long)(local_4c + 3) + 5] = local_1e0;
      auVar18 = vfmadd213ss_fma(ZEXT416((uint)local_1d4),ZEXT416((uint)local_1d4),
                                ZEXT416((uint)(local_1d8 * local_1d8)));
      auVar18 = vfmadd213ss_fma(ZEXT416((uint)local_1dc),ZEXT416((uint)local_1dc),auVar18);
      auVar18 = vfmadd213ss_fma(ZEXT416((uint)local_1e0),ZEXT416((uint)local_1e0),auVar18);
      local_50 = auVar18._0_4_ + local_50;
      local_4c = local_4c + 4;
    }
  }
  fVar33 = sqrtf(local_50);
  for (local_22c = 0; local_22c < 0x40; local_22c = local_22c + 1) {
    in_RSI[(long)local_22c + 5] = (1.0 / fVar33) * in_RSI[(long)local_22c + 5];
  }
  return;
}

Assistant:

void get_msurf_descriptor_haar_unroll_4_3_True(struct integral_image* iimage, struct interest_point* ipoint) {

    float scale = ipoint->scale;
    int int_scale = (int) roundf(scale);
    float scale_squared = scale*scale;
    float g1_factor = -0.08f / (scale_squared); 

    float ipoint_x = roundf(ipoint->x) + 0.5*scale;
    float ipoint_y = roundf(ipoint->y) + 0.5*scale;

    float ipoint_x_sub_int_scale = ipoint_x-int_scale;
    float ipoint_y_sub_int_scale = ipoint_y-int_scale;

    float ipoint_x_sub_int_scale_add_05 = ipoint_x-int_scale + 0.5;
    float ipoint_y_sub_int_scale_add_05 = ipoint_y-int_scale + 0.5;
    
    int width = iimage->width;
    int height = iimage->height;

    // build descriptor
    float* descriptor = ipoint->descriptor;
    int desc_idx = 0;
    float sum_of_squares = 0.0f;

    // Initializing gauss_s2 index for precomputed array
    int gauss_s2_index = 0;

    // check if we ever hit a boundary
    if (((int) roundf(ipoint_x - 12*scale)) - int_scale <= 0 
        || ((int) roundf(ipoint_y - 12*scale)) - int_scale <= 0 
        || ((int) roundf(ipoint_x + 11*scale)) + int_scale > width 
        || ((int) roundf(ipoint_y + 11*scale)) + int_scale > height) 
    {
        for (int l=-12, l_count=0; l<12; l+=4, l_count+=4) {
            int l0 = l + 0;
            int l1 = l + 1;
            int l2 = l + 2;
            int l3 = l + 3;
            int l_count0 = l_count + 0;
            int l_count1 = l_count + 1;
            int l_count2 = l_count + 2;
            int l_count3 = l_count + 3;
            float ipoint_y_sub_int_scale_add_l0_mul_scale = ipoint_y_sub_int_scale + l0 * scale;
            float ipoint_y_sub_int_scale_add_l1_mul_scale = ipoint_y_sub_int_scale + l1 * scale;
            float ipoint_y_sub_int_scale_add_l2_mul_scale = ipoint_y_sub_int_scale + l2 * scale;
            float ipoint_y_sub_int_scale_add_l3_mul_scale = ipoint_y_sub_int_scale + l3 * scale;
            int sample_y_sub_int_scale0 = (int) (ipoint_y_sub_int_scale_add_l0_mul_scale + (ipoint_y_sub_int_scale_add_l0_mul_scale>=0 ? 0.5 : -0.5));
            int sample_y_sub_int_scale1 = (int) (ipoint_y_sub_int_scale_add_l1_mul_scale + (ipoint_y_sub_int_scale_add_l1_mul_scale>=0 ? 0.5 : -0.5));
            int sample_y_sub_int_scale2 = (int) (ipoint_y_sub_int_scale_add_l2_mul_scale + (ipoint_y_sub_int_scale_add_l2_mul_scale>=0 ? 0.5 : -0.5));
            int sample_y_sub_int_scale3 = (int) (ipoint_y_sub_int_scale_add_l3_mul_scale + (ipoint_y_sub_int_scale_add_l3_mul_scale>=0 ? 0.5 : -0.5));

            for (int k=-12, k_count=0; k<12; k+=3, k_count+=3) {
                int k0 = k + 0;
                int k1 = k + 1;
                int k2 = k + 2;
                int k_count0 = k_count + 0;
                int k_count1 = k_count + 1;
                int k_count2 = k_count + 2;
                float ipoint_x_sub_int_scale_add_k0_mul_scale = ipoint_x_sub_int_scale + k0 * scale;
                float ipoint_x_sub_int_scale_add_k1_mul_scale = ipoint_x_sub_int_scale + k1 * scale;
                float ipoint_x_sub_int_scale_add_k2_mul_scale = ipoint_x_sub_int_scale + k2 * scale;
                int sample_x_sub_int_scale0 = (int) (ipoint_x_sub_int_scale_add_k0_mul_scale + (ipoint_x_sub_int_scale_add_k0_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale1 = (int) (ipoint_x_sub_int_scale_add_k1_mul_scale + (ipoint_x_sub_int_scale_add_k1_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale2 = (int) (ipoint_x_sub_int_scale_add_k2_mul_scale + (ipoint_x_sub_int_scale_add_k2_mul_scale>=0 ? 0.5 : -0.5));

                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count0*24+k_count0], &haarResponseY[l_count0*24+k_count0]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count1*24+k_count0], &haarResponseY[l_count1*24+k_count0]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale2, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count2*24+k_count0], &haarResponseY[l_count2*24+k_count0]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale3, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count3*24+k_count0], &haarResponseY[l_count3*24+k_count0]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count0*24+k_count1], &haarResponseY[l_count0*24+k_count1]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count1*24+k_count1], &haarResponseY[l_count1*24+k_count1]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale2, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count2*24+k_count1], &haarResponseY[l_count2*24+k_count1]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale3, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count3*24+k_count1], &haarResponseY[l_count3*24+k_count1]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count0*24+k_count2], &haarResponseY[l_count0*24+k_count2]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count1*24+k_count2], &haarResponseY[l_count1*24+k_count2]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale2, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count2*24+k_count2], &haarResponseY[l_count2*24+k_count2]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale3, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count3*24+k_count2], &haarResponseY[l_count3*24+k_count2]);
            }
        }
    } else {
        for (int l=-12, l_count=0; l<12; l+=4, l_count+=4) {
            int l0 = l + 0;
            int l1 = l + 1;
            int l2 = l + 2;
            int l3 = l + 3;
            int l_count0 = l_count + 0;
            int l_count1 = l_count + 1;
            int l_count2 = l_count + 2;
            int l_count3 = l_count + 3;
            int sample_y_sub_int_scale0 = (int) (ipoint_y_sub_int_scale_add_05 + l0 * scale);
            int sample_y_sub_int_scale1 = (int) (ipoint_y_sub_int_scale_add_05 + l1 * scale);
            int sample_y_sub_int_scale2 = (int) (ipoint_y_sub_int_scale_add_05 + l2 * scale);
            int sample_y_sub_int_scale3 = (int) (ipoint_y_sub_int_scale_add_05 + l3 * scale);

            for (int k=-12, k_count=0; k<12; k+=3, k_count+=3) {
                int k0 = k + 0;
                int k1 = k + 1;
                int k2 = k + 2;
                int k_count0 = k_count + 0;
                int k_count1 = k_count + 1;
                int k_count2 = k_count + 2;
                int sample_x_sub_int_scale0 = (int) (ipoint_x_sub_int_scale_add_05 + k0 * scale);
                int sample_x_sub_int_scale1 = (int) (ipoint_x_sub_int_scale_add_05 + k1 * scale);
                int sample_x_sub_int_scale2 = (int) (ipoint_x_sub_int_scale_add_05 + k2 * scale);

                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count0*24+k_count0], &haarResponseY[l_count0*24+k_count0]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count1*24+k_count0], &haarResponseY[l_count1*24+k_count0]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale2, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count2*24+k_count0], &haarResponseY[l_count2*24+k_count0]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale3, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count3*24+k_count0], &haarResponseY[l_count3*24+k_count0]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count0*24+k_count1], &haarResponseY[l_count0*24+k_count1]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count1*24+k_count1], &haarResponseY[l_count1*24+k_count1]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale2, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count2*24+k_count1], &haarResponseY[l_count2*24+k_count1]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale3, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count3*24+k_count1], &haarResponseY[l_count3*24+k_count1]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count0*24+k_count2], &haarResponseY[l_count0*24+k_count2]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count1*24+k_count2], &haarResponseY[l_count1*24+k_count2]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale2, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count2*24+k_count2], &haarResponseY[l_count2*24+k_count2]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale3, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count3*24+k_count2], &haarResponseY[l_count3*24+k_count2]);
            }
        }
    }

    float s0  = roundf( 0.5 * scale);
    float s1  = roundf( 1.5 * scale);
    float s2  = roundf( 2.5 * scale);
    float s3  = roundf( 3.5 * scale);
    float s4  = roundf( 4.5 * scale);
    float s5  = roundf( 5.5 * scale);
    float s6  = roundf( 6.5 * scale);
    float s7  = roundf( 7.5 * scale);
    float s8  = roundf( 8.5 * scale);
    float s9  = roundf( 9.5 * scale);
    float s10 = roundf(10.5 * scale);
    float s11 = roundf(11.5 * scale);

    float e_c0_m4 = s2 + s1; // CAREFUL HERE!
    float e_c0_m3 = s2 + s0; // CAREFUL HERE!
    float e_c0_m2 = s2 - s0;
    float e_c0_m1 = s2 - s1;
    //float e_c0_z0 = s2 - s2;
    float e_c0_p1 = s2 - s3;
    float e_c0_p2 = s2 - s4;
    float e_c0_p3 = s2 - s5;
    float e_c0_p4 = s2 - s6;

    float e_c1_m4 = s7 - s3;
    float e_c1_m3 = s7 - s4;
    float e_c1_m2 = s7 - s5;
    float e_c1_m1 = s7 - s6;
    //float e_c1_z0 = s7 - s7;
    float e_c1_p1 = s7 - s8;
    float e_c1_p2 = s7 - s9;
    float e_c1_p3 = s7 - s10;
    float e_c1_p4 = s7 - s11;

    gauss_s1_c0[0] =  expf(g1_factor * (e_c0_m4 * e_c0_m4));
    gauss_s1_c0[1] =  expf(g1_factor * (e_c0_m3 * e_c0_m3));
    gauss_s1_c0[2] =  expf(g1_factor * (e_c0_m2 * e_c0_m2));
    gauss_s1_c0[3] =  expf(g1_factor * (e_c0_m1 * e_c0_m1));
    gauss_s1_c0[4] =  1.0f; //expf(g1_factor * (e_c0_z0 * e_c0_z0));
    gauss_s1_c0[5] =  expf(g1_factor * (e_c0_p1 * e_c0_p1));
    gauss_s1_c0[6] =  expf(g1_factor * (e_c0_p2 * e_c0_p2));
    gauss_s1_c0[7] =  expf(g1_factor * (e_c0_p3 * e_c0_p3));
    gauss_s1_c0[8] =  expf(g1_factor * (e_c0_p4 * e_c0_p4));

    gauss_s1_c1[0] =  expf(g1_factor * (e_c1_m4 * e_c1_m4));
    gauss_s1_c1[1] =  expf(g1_factor * (e_c1_m3 * e_c1_m3));
    gauss_s1_c1[2] =  expf(g1_factor * (e_c1_m2 * e_c1_m2));
    gauss_s1_c1[3] =  expf(g1_factor * (e_c1_m1 * e_c1_m1));
    gauss_s1_c1[4] =  1.0f; //expf(g1_factor * (e_c1_z0 * e_c1_z0));
    gauss_s1_c1[5] =  expf(g1_factor * (e_c1_p1 * e_c1_p1));
    gauss_s1_c1[6] =  expf(g1_factor * (e_c1_p2 * e_c1_p2));
    gauss_s1_c1[7] =  expf(g1_factor * (e_c1_p3 * e_c1_p3));
    gauss_s1_c1[8] =  expf(g1_factor * (e_c1_p4 * e_c1_p4));

    // calculate descriptor for this interest point
    for (int i=-8; i<8; i+=5) {

        float *i_arr;
        if (i == -8 || i == 7) {
            i_arr = gauss_s1_c1;
        } else {
            i_arr = gauss_s1_c0;
        } 

        int gauss_index_k_start = (i<0?8:0);
        int gauss_index_k_inc = (i<0?-1:1);

        for (int j=-8; j<8; j+=5) {

            float *j_arr;
            if (j == -8 || j == 7) {
                j_arr = gauss_s1_c1;
            } else {
                j_arr = gauss_s1_c0;
            } 

            float dx = 0.0f;
            float dy = 0.0f; 
            float mdx = 0.0f; 
            float mdy = 0.0f;

            int gauss_index_l = (j<0?8:0);
            int gauss_index_l_inc = (j<0?-1:1);
            for (int l = (j+8)*24; l < (j + 17)*24; l+=24, gauss_index_l+=gauss_index_l_inc) {
                float gauss_s1_y = j_arr[gauss_index_l];

                int gauss_index_k = gauss_index_k_start;
                for (int k = i+8; k < i + 17; ++k, gauss_index_k+=gauss_index_k_inc) {
                    
                    float gauss_s1_x = i_arr[gauss_index_k];

                    float gauss_s1 = gauss_s1_x * gauss_s1_y;

                    float rx = haarResponseX[l+k];
                    float ry = haarResponseY[l+k];
                    
                    //Get the gaussian weighted x and y responses on rotated axis
                    float rrx = gauss_s1 * ry;
                    float rry = gauss_s1 * rx;

                    dx += rrx;
                    dy += rry;
                    mdx += fabsf(rrx);
                    mdy += fabsf(rry);
                }
            }

            // Precomputed 4x4 gauss_s2 with (x,y) = {-1.5, -0.5, 0.5, 1.5}^2 and sig = 1.5f
            float gauss_s2 = gauss_s2_arr[gauss_s2_index];
            gauss_s2_index++;

            // add the values to the descriptor vector
            float d1 = dx * gauss_s2;
            float d2 = dy * gauss_s2;
            float d3 = mdx * gauss_s2;
            float d4 = mdy * gauss_s2;

            descriptor[desc_idx] = d1;
            descriptor[desc_idx+1] = d2;
            descriptor[desc_idx+2] = d3;
            descriptor[desc_idx+3] = d4;

            // precompute for normaliztion
            sum_of_squares += (d1*d1 + d2*d2 + d3*d3 + d4*d4);

            desc_idx += 4;

        }
    }

    // rescale to unit vector
    // NOTE: using sqrtf() for floats
    float norm_factor = 1.0f / sqrtf(sum_of_squares);

    for (int i = 0; i < 64; ++i) {
        descriptor[i] *= norm_factor;
    }
}